

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLeggedOdometry.cpp
# Opt level: O3

SimpleLeggedOdometry * __thiscall
iDynTree::SimpleLeggedOdometry::getWorldLinkTransform
          (SimpleLeggedOdometry *this,LinkIndex link_index)

{
  char cVar1;
  Transform *pTVar2;
  long in_RDX;
  char *pcVar3;
  Transform base_H_link;
  Transform base_H_fixed;
  Transform local_148 [96];
  Transform local_e8 [96];
  Transform local_88 [96];
  
  if ((*(char *)(link_index + 0x191) == '\x01') && (*(char *)(link_index + 0x192) != '\0')) {
    cVar1 = iDynTree::Model::isValidLinkIndex(link_index);
    if (cVar1 != '\0') {
      pTVar2 = (Transform *)
               iDynTree::LinkPositions::operator()
                         ((LinkPositions *)(link_index + 0x1a0),*(long *)(link_index + 0x198));
      iDynTree::Transform::Transform(local_88,pTVar2);
      pTVar2 = (Transform *)
               iDynTree::LinkPositions::operator()((LinkPositions *)(link_index + 0x1a0),in_RDX);
      iDynTree::Transform::Transform(local_e8,pTVar2);
      iDynTree::Transform::inverse();
      iDynTree::Transform::operator*(local_148,(Transform *)(link_index + 0x1b8));
      iDynTree::Transform::operator*((Transform *)this,local_148);
      return this;
    }
    pcVar3 = "getWorldLinkTransform was called, but the request linkindex is not part of the model";
  }
  else {
    pcVar3 = 
    "getWorldLinkTransform was called, but the kinematics update or the odometry init was never setted."
    ;
  }
  iDynTree::reportError("SimpleLeggedOdometry","getWorldLinkTransform",pcVar3);
  iDynTree::Transform::Identity();
  return this;
}

Assistant:

Transform SimpleLeggedOdometry::getWorldLinkTransform(const LinkIndex link_index)
{
    if( !this->m_kinematicsUpdated || !this->m_isOdometryInitialized  )
    {
        reportError("SimpleLeggedOdometry",
                    "getWorldLinkTransform",
                    "getWorldLinkTransform was called, but the kinematics update or the odometry init was never setted.");
        return Transform::Identity();
    }

    if( !this->m_model.isValidLinkIndex(link_index) )
    {
        reportError("SimpleLeggedOdometry",
                    "getWorldLinkTransform",
                    "getWorldLinkTransform was called, but the request linkindex is not part of the model");
        return Transform::Identity();
    }

    assert(m_fixedLinkIndex < static_cast<LinkIndex>(m_base_H_link.getNrOfLinks()));
    Transform base_H_fixed = m_base_H_link(m_fixedLinkIndex);
    Transform base_H_link =  m_base_H_link(link_index);

    return m_world_H_fixedLink*base_H_fixed.inverse()*base_H_link;
}